

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void __thiscall
embree::ISPCScene::ISPCScene
          (ISPCScene *this,RTCDevice device,uint numGeometries,uint numMaterials,uint numLights)

{
  size_t i;
  RTCScene pRVar1;
  ISPCGeometry **ppIVar2;
  ulong uVar3;
  ISPCMaterial **ppIVar4;
  Light **ppLVar5;
  
  pRVar1 = (RTCScene)rtcNewScene(device);
  this->scene = pRVar1;
  this->geometries = (ISPCGeometry **)0x0;
  this->materials = (ISPCMaterial **)0x0;
  this->numGeometries = numGeometries;
  this->numMaterials = numMaterials;
  this->lights = (Light **)0x0;
  this->numLights = numLights;
  this->tutorialScene = (void *)0x0;
  ppIVar2 = (ISPCGeometry **)alignedUSMMalloc((ulong)numGeometries * 8,0x10,DEVICE_READ_ONLY);
  this->geometries = ppIVar2;
  for (uVar3 = 0; numGeometries != uVar3; uVar3 = uVar3 + 1) {
    this->geometries[uVar3] = (ISPCGeometry *)0x0;
  }
  ppIVar4 = (ISPCMaterial **)alignedUSMMalloc((ulong)numMaterials * 8,0x10,DEVICE_READ_ONLY);
  this->materials = ppIVar4;
  for (uVar3 = 0; numMaterials != uVar3; uVar3 = uVar3 + 1) {
    this->materials[uVar3] = (ISPCMaterial *)0x0;
  }
  ppLVar5 = (Light **)alignedUSMMalloc((ulong)numLights * 8,0x10,DEVICE_READ_ONLY);
  this->lights = ppLVar5;
  for (uVar3 = 0; numLights != uVar3; uVar3 = uVar3 + 1) {
    this->lights[uVar3] = (Light *)0x0;
  }
  return;
}

Assistant:

ISPCScene::ISPCScene(RTCDevice device, unsigned int numGeometries, unsigned int numMaterials, unsigned int numLights)
    : scene(rtcNewScene(device)), geometries(nullptr), materials(nullptr), numGeometries(numGeometries), numMaterials(numMaterials), lights(0), numLights(numLights), tutorialScene(nullptr)
  {
    geometries = (ISPCGeometry**) alignedUSMMalloc(numGeometries*sizeof(ISPCGeometry*));
    for (size_t i=0; i<numGeometries; i++) geometries[i] = nullptr;
    
    materials = (ISPCMaterial**) alignedUSMMalloc(numMaterials*sizeof(ISPCMaterial*));
    for (size_t i=0; i<numMaterials; i++) materials[i] = nullptr;
    
    lights = (Light**) alignedUSMMalloc(numLights*sizeof(Light*));
    for (size_t i=0; i<numLights; i++) lights[i] = nullptr;
  }